

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O2

int check_ca(X509 *x)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = x->ex_flags;
  if (((uVar1 & 2) == 0) || (uVar2 = 0, (x->ex_kusage & 4) != 0)) {
    if ((~uVar1 & 0x2040) == 0) {
      return 1;
    }
    uVar2 = uVar1 >> 4 & uVar1 & 1;
  }
  return uVar2;
}

Assistant:

static int check_ca(const X509 *x) {
  // keyUsage if present should allow cert signing
  if (ku_reject(x, X509v3_KU_KEY_CERT_SIGN)) {
    return 0;
  }
  // Version 1 certificates are considered CAs and don't have extensions.
  if ((x->ex_flags & V1_ROOT) == V1_ROOT) {
    return 1;
  }
  // Otherwise, it's only a CA if basicConstraints says so.
  return ((x->ex_flags & EXFLAG_BCONS) && (x->ex_flags & EXFLAG_CA));
}